

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::UpdateAlignmentCache(BamMultiReaderPrivate *this)

{
  pointer pMVar1;
  IMultiMerger *pIVar2;
  MergeItem *item;
  pointer pMVar3;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pIVar2 = this->m_alignmentCache;
  if (pIVar2 == (IMultiMerger *)0x0) {
    pIVar2 = CreateAlignmentCache(this);
    this->m_alignmentCache = pIVar2;
    if (pIVar2 == (IMultiMerger *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_38,"BamMultiReader::UpdateAlignmentCache",&local_59);
      std::__cxx11::string::string
                ((string *)&local_58,"unable to create new alignment cache",&local_5a);
      SetErrorString(this,&local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      return false;
    }
  }
  (*pIVar2->_vptr_IMultiMerger[3])();
  pMVar1 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (this->m_readers).
                super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    if (pMVar3->Alignment != (BamAlignment *)0x0 && pMVar3->Reader != (BamReader *)0x0) {
      SaveNextAlignment(this,pMVar3->Reader,pMVar3->Alignment);
    }
  }
  return true;
}

Assistant:

bool BamMultiReaderPrivate::UpdateAlignmentCache()
{

    // create alignment cache if not created yet
    if (m_alignmentCache == 0) {
        m_alignmentCache = CreateAlignmentCache();
        if (m_alignmentCache == 0) {
            SetErrorString("BamMultiReader::UpdateAlignmentCache",
                           "unable to create new alignment cache");
            return false;
        }
    }

    // clear any prior cache data
    m_alignmentCache->Clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        BamAlignment* alignment = item.Alignment;
        if (reader == 0 || alignment == 0) continue;

        // save next alignment from each reader in cache
        SaveNextAlignment(reader, alignment);
    }

    // if we get here, ok
    return true;
}